

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fs_write_alotof_bufs(int add_flags)

{
  int iVar1;
  int iVar2;
  uv_buf_t *bufs;
  void *__ptr;
  __off64_t _Var3;
  uv_buf_t uVar4;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  void *eval_b_1;
  void *eval_a_1;
  size_t local_60;
  void *eval_b;
  void *eval_a;
  ulong uStack_40;
  int r;
  size_t index;
  char *buffer;
  uv_buf_t *iovs;
  size_t iovmax;
  size_t iovcount;
  int add_flags_local;
  
  iovmax = 0xd431;
  unlink("test_file");
  loop = uv_default_loop();
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd08,"iovs","!=","NULL",0,"!=",0);
    abort();
  }
  iVar1 = uv_test_getiovmax();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",add_flags | 0x42,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd11,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd12,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  for (uStack_40 = 0; uStack_40 < 0xd431; uStack_40 = uStack_40 + 1) {
    uVar4 = uv_buf_init(test_buf,0xd);
    eval_a_1 = uVar4.base;
    bufs[uStack_40].base = (char *)eval_a_1;
    local_60 = uVar4.len;
    bufs[uStack_40].len = local_60;
  }
  iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                      (uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd1f,"r >= 0");
    abort();
  }
  if (write_req.result != 0xac67d) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd20,"(size_t)write_req.result == sizeof(test_buf) * iovcount");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  __ptr = malloc(0xac67d);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd25,"buffer","!=","NULL",0,"!=",0);
    abort();
  }
  for (uStack_40 = 0; uStack_40 < 0xd431; uStack_40 = uStack_40 + 1) {
    uVar4 = uv_buf_init((char *)((long)__ptr + uStack_40 * 0xd),0xd);
    local_88 = uVar4.base;
    bufs[uStack_40].base = local_88;
    local_80 = uVar4.len;
    bufs[uStack_40].len = local_80;
  }
  iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd2c,"r == 0");
    abort();
  }
  if (close_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd2d,"close_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",add_flags,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd32,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd33,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                     (uv_fs_cb)0x0);
  if ((ulong)(long)iVar1 < 0xd431) {
    iovmax = (long)iVar1;
  }
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd39,"r >= 0");
    abort();
  }
  if (read_req.result != iovmax * 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd3a,"(size_t)read_req.result == sizeof(test_buf) * iovcount");
    abort();
  }
  for (uStack_40 = 0; uStack_40 < iovmax; uStack_40 = uStack_40 + 1) {
    iVar1 = strncmp((char *)((long)__ptr + uStack_40 * 0xd),test_buf,0xd);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0xd3f,"strncmp(buffer + index * sizeof(test_buf), test_buf, sizeof(test_buf)) == 0");
      abort();
    }
  }
  uv_fs_req_cleanup(&read_req);
  free(__ptr);
  _Var3 = lseek64((int)open_req1.result,write_req.result,0);
  if (_Var3 != write_req.result) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd44,"lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result");
    abort();
  }
  uVar4 = uv_buf_init(buf,0x20);
  local_98 = uVar4.base;
  iov.base = local_98;
  local_90 = uVar4.len;
  iov.len = local_90;
  iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd4d,"r == 0");
    abort();
  }
  if (read_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd4e,"read_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd52,"r == 0");
    abort();
  }
  if (close_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd53,"close_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  unlink("test_file");
  free(bufs);
  return;
}

Assistant:

static void fs_write_alotof_bufs(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;

  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  -1,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
    NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, iovcount, -1, NULL);
  if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT(r >= 0);
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  ASSERT(lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result);
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 -1,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}